

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Tree_Item.cxx
# Opt level: O3

Fl_Tree_Item * __thiscall Fl_Tree_Item::find_item(Fl_Tree_Item *this,char **names)

{
  int iVar1;
  Fl_Tree_Item *pFVar2;
  
  if (*names != (char *)0x0) {
    if ((this->_label != (char *)0x0) && (iVar1 = strcmp(this->_label,*names), iVar1 == 0)) {
      if (names[1] == (char *)0x0) {
        return this;
      }
      names = names + 1;
    }
    if ((this->_children)._total != 0) {
      pFVar2 = find_child_item(this,names);
      return pFVar2;
    }
  }
  return (Fl_Tree_Item *)0x0;
}

Assistant:

const Fl_Tree_Item *Fl_Tree_Item::find_item(char **names) const {
  if ( ! *names ) return(0);
  if ( label() && strcmp(label(), *names) == 0 ) {	// match self?
    ++names;						// skip self
    if ( *names == 0 ) return(this);			// end of names, found ourself
  }
  if ( children() ) {					// check children..
    return(find_child_item(names));
  }
  return(0);
}